

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

int Abc_NodeCompareNames(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  uint uVar5;
  
  pAVar2 = *pp1;
  pAVar3 = *pp2;
  iVar4 = strcmp((char *)(pAVar2->field_6).pTemp,(char *)(pAVar3->field_6).pTemp);
  uVar5 = 0xffffffff;
  if ((-1 < iVar4) && (uVar5 = 1, iVar4 == 0)) {
    iVar4 = pAVar3->Id;
    uVar5 = 0xffffffff;
    iVar1 = pAVar2->Id;
    if (iVar4 <= iVar1) {
      uVar5 = (uint)(iVar1 != iVar4);
    }
  }
  return uVar5;
}

Assistant:

int Abc_NodeCompareNames( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = strcmp( (char *)(*pp1)->pCopy, (char *)(*pp2)->pCopy );
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1)->Id - (*pp2)->Id;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}